

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssimpCExport.cpp
# Opt level: O0

aiReturn aiExportSceneEx(aiScene *pScene,char *pFormatId,char *pFileName,aiFileIO *pIO,
                        uint pPreprocessing)

{
  aiReturn aVar1;
  CIOSystemWrapper *this;
  char *num_bytes;
  Exporter local_38;
  Exporter exp;
  uint pPreprocessing_local;
  aiFileIO *pIO_local;
  char *pFileName_local;
  char *pFormatId_local;
  aiScene *pScene_local;
  
  num_bytes = pFormatId;
  exp.pimpl._4_4_ = pPreprocessing;
  Assimp::Exporter::Exporter(&local_38);
  if (pIO != (aiFileIO *)0x0) {
    this = (CIOSystemWrapper *)
           Assimp::Intern::AllocateFromAssimpHeap::operator_new
                     ((AllocateFromAssimpHeap *)0x28,(size_t)num_bytes);
    Assimp::CIOSystemWrapper::CIOSystemWrapper(this,pIO);
    Assimp::Exporter::SetIOHandler(&local_38,(IOSystem *)this);
  }
  aVar1 = Assimp::Exporter::Export
                    (&local_38,pScene,pFormatId,pFileName,exp.pimpl._4_4_,(ExportProperties *)0x0);
  Assimp::Exporter::~Exporter(&local_38);
  return aVar1;
}

Assistant:

ASSIMP_API aiReturn aiExportSceneEx( const aiScene* pScene, const char* pFormatId, const char* pFileName, aiFileIO* pIO, unsigned int pPreprocessing )
{
    Exporter exp;

    if (pIO) {
        exp.SetIOHandler(new CIOSystemWrapper(pIO));
    }
    return exp.Export(pScene,pFormatId,pFileName,pPreprocessing);
}